

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macros.cc
# Opt level: O2

bool __thiscall pstack::Dwarf::Macros::visit4(Macros *this,Unit *u,MacroVisitor *visitor)

{
  LineInfo *pLVar1;
  bool bVar2;
  uint8_t uVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  bool bVar7;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  undefined1 local_98 [8];
  string text;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_60;
  DWARFReader local_58;
  
  local_68 = Unit::getLines(u);
  std::__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&text.field_2 + 8),
             &(this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>);
  local_58.off = 0;
  local_58.end = (**(code **)(*(long *)text.field_2._8_8_ + 0x40))();
  local_60 = &local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)text.field_2._8_8_;
  local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_70._M_pi;
  text.field_2._8_8_ = 0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58.addrLen = 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffff90);
  bVar2 = false;
switchD_0015d7a7_default:
  bVar7 = bVar2;
  if (bVar7) goto LAB_0015d8a4;
  uVar3 = DWARFReader::getu8(&local_58);
  bVar2 = false;
  switch(uVar3) {
  case '\0':
    bVar2 = true;
    goto switchD_0015d7a7_default;
  case '\x01':
    iVar5 = (*(local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_Reader[3])
                      (local_58.io.
                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_58.off);
    local_58.off = local_58.off + extraout_RDX_02;
    DWARFReader::getstring_abi_cxx11_((string *)local_98,&local_58);
    (*(code *)**(undefined8 **)visitor)(visitor,iVar5,(string *)local_98);
    break;
  case '\x02':
    iVar5 = (*(local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_Reader[3])
                      (local_58.io.
                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_58.off);
    local_58.off = local_58.off + extraout_RDX;
    DWARFReader::getstring_abi_cxx11_((string *)local_98,&local_58);
    (**(code **)(*(long *)visitor + 8))(visitor,iVar5,(string *)local_98);
    break;
  case '\x03':
    iVar5 = (*(local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_Reader[3])
                      (local_58.io.
                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_58.off);
    local_58.off = extraout_RDX_00 + local_58.off;
    iVar6 = (*(local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_Reader[3])
                      (local_58.io.
                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_58.off);
    local_58.off = local_58.off + extraout_RDX_01;
    pLVar1 = (local_68->_M_t).
             super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
             .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl;
    cVar4 = (**(code **)(*(long *)visitor + 0x10))
                      (visitor,iVar5,
                       (ulong)*(uint *)(*(long *)&(pLVar1->files).
                                                  super__Vector_base<pstack::Dwarf::FileEntry,_std::allocator<pstack::Dwarf::FileEntry>_>
                                                  ._M_impl + 0x20 +
                                       CONCAT44(extraout_var,iVar6) * 0x30) * 0x20 +
                       *(long *)&(pLVar1->directories).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl);
    goto joined_r0x0015d7ba;
  case '\x04':
    cVar4 = (**(code **)(*(long *)visitor + 0x18))(visitor);
joined_r0x0015d7ba:
    bVar2 = false;
    if (cVar4 == '\0') {
LAB_0015d8a4:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return bVar7;
    }
  default:
    goto switchD_0015d7a7_default;
  }
  std::__cxx11::string::~string((string *)local_98);
  bVar2 = false;
  goto switchD_0015d7a7_default;
}

Assistant:

bool
Macros::visit4(Unit &u, MacroVisitor *visitor) const
{
    const auto &lineinfo = u.getLines();
    DWARFReader dr(io);
    for (bool done = false; !done; ) {
        auto code = DWARF_MACINFO_CODE(dr.getu8());
        switch (code) {
            case DW_MACINFO_define: {
                auto line = dr.getuleb128();
                auto text = dr.getstring();
                visitor->define(line, text);
                break;
            }
            case DW_MACINFO_eol: {
                done = true;
                break;
            }
            case DW_MACINFO_undef: {
                auto line = dr.getuleb128();
                auto text = dr.getstring();
                visitor->undef(line, text);
                break;
            }
            case DW_MACINFO_start_file: {
                auto line = dr.getuleb128();
                auto file = dr.getuleb128();
                auto &fileinfo = lineinfo->files[file];
                if (!visitor->startFile(line, lineinfo->directories[fileinfo.dirindex], fileinfo))
                    return false;
                break;
            }
            case DW_MACINFO_end_file: {
                if (!visitor->endFile())
                    return 0;
                break;
            }
            case DW_MACINFO_vendor_ext:
                break;
        }
    }
    return true;
}